

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

int __thiscall despot::Planner::RunEvaluation(Planner *this,int argc,char **argv)

{
  string world_type_00;
  string solver_type_00;
  int iVar1;
  Option *options;
  clock_t cVar2;
  undefined4 extraout_var;
  World *pWVar3;
  undefined4 extraout_var_01;
  Belief *belief;
  Solver *solver_00;
  char *__assertion;
  uint __line;
  undefined8 in_stack_fffffffffffffe88;
  int num_runs;
  bool search_solver;
  Logger *logger;
  undefined4 uStack_160;
  int time_limit;
  Belief *local_158;
  Solver *solver;
  ulong local_148;
  World *local_140;
  clock_t local_138;
  string belief_type;
  string solver_type;
  string world_type;
  string local_d0 [32];
  string local_b0 [32];
  string local_90;
  string local_70 [32];
  string local_50 [32];
  DSPOMDP *model;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  (*(this->super_PlannerBase)._vptr_PlannerBase[5])(&solver_type,this);
  num_runs = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&world_type,"pomdp",(allocator<char> *)&belief_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&belief_type,"DEFAULT",(allocator<char> *)&solver);
  time_limit = -1;
  options = PlannerBase::InitializeParamers
                      (&this->super_PlannerBase,argc,argv,&solver_type,&search_solver,&num_runs,
                       &world_type,&belief_type,&time_limit);
  if (options == (Option *)0x0) {
LAB_00155d8f:
    std::__cxx11::string::~string((string *)&belief_type);
    std::__cxx11::string::~string((string *)&world_type);
    std::__cxx11::string::~string((string *)&solver_type);
    return 0;
  }
  cVar2 = clock();
  iVar1 = (*(this->super_PlannerBase)._vptr_PlannerBase[2])(this,options);
  model = (DSPOMDP *)CONCAT44(extraout_var,iVar1);
  if (model == (DSPOMDP *)0x0) {
    __assertion = "model != NULL";
    __line = 0x4d;
  }
  else {
    iVar1 = (*(this->super_PlannerBase)._vptr_PlannerBase[3])(this,&world_type,model,options);
    pWVar3 = (World *)CONCAT44(extraout_var_00,iVar1);
    if (pWVar3 == (World *)0x0) {
      __assertion = "world != NULL";
      __line = 0x53;
    }
    else {
      iVar1 = (*pWVar3->_vptr_World[4])(pWVar3);
      std::__cxx11::string::string(local_70,(string *)&belief_type);
      iVar1 = (*model->_vptr_DSPOMDP[9])(model,CONCAT44(extraout_var_01,iVar1),local_70);
      belief = (Belief *)CONCAT44(extraout_var_02,iVar1);
      std::__cxx11::string::~string(local_70);
      if (belief != (Belief *)0x0) {
        std::__cxx11::string::string((string *)&local_90,(string *)&solver_type);
        local_158 = belief;
        solver_00 = PlannerBase::InitializeSolver
                              (&this->super_PlannerBase,model,belief,&local_90,options);
        local_140 = pWVar3;
        local_138 = cVar2;
        std::__cxx11::string::~string((string *)&local_90);
        logger = (Logger *)0x0;
        local_148 = (ulong)(uint)num_runs;
        solver = solver_00;
        std::__cxx11::string::string(local_b0,(string *)&world_type);
        iVar1 = time_limit;
        std::__cxx11::string::string(local_50,(string *)&solver_type);
        cVar2 = local_138;
        pWVar3 = local_140;
        world_type_00._M_string_length._0_4_ = iVar1;
        world_type_00._M_dataplus._M_p = (pointer)local_b0;
        world_type_00._M_string_length._4_4_ = 0;
        world_type_00.field_2._M_allocated_capacity = (size_type)local_50;
        world_type_00.field_2._8_8_ = in_stack_fffffffffffffe88;
        solver_type_00._M_string_length._0_4_ = uStack_160;
        solver_type_00._M_dataplus._M_p = (pointer)logger;
        solver_type_00._M_string_length._4_4_ = time_limit;
        solver_type_00.field_2._M_allocated_capacity = (size_type)local_158;
        solver_type_00.field_2._8_8_ = solver;
        PlannerBase::InitializeLogger
                  (&this->super_PlannerBase,&logger,options,model,local_158,solver_00,(int)local_148
                   ,local_138,local_140,world_type_00,num_runs,solver_type_00);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string(local_b0);
        PlannerBase::DisplayParameters(&this->super_PlannerBase,options,model);
        std::__cxx11::string::string(local_d0,(string *)&belief_type);
        (*(this->super_PlannerBase)._vptr_PlannerBase[10])
                  (this,model,pWVar3,local_158,local_d0,&solver,logger,options,cVar2,
                   (ulong)(uint)num_runs,0);
        std::__cxx11::string::~string(local_d0);
        PlannerBase::PrintResult(&this->super_PlannerBase,num_runs,logger,cVar2);
        goto LAB_00155d8f;
      }
      __assertion = "belief != NULL";
      __line = 0x59;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/evaluator.cpp"
                ,__line,"virtual int despot::Planner::RunEvaluation(int, char **)");
}

Assistant:

int Planner::RunEvaluation(int argc, char *argv[]) {

	/* =========================
	 * initialize parameters
	 * =========================*/
	string solver_type = ChooseSolver();
	bool search_solver;
	int num_runs = 1;
	string world_type = "pomdp";
	string belief_type = "DEFAULT";
	int time_limit = -1;

	option::Option *options = InitializeParamers(argc, argv, solver_type,
			search_solver, num_runs, world_type, belief_type, time_limit);
	if(options==NULL)
		return 0;
	clock_t main_clock_start = clock();

	/* =========================
	 * initialize model
	 * =========================*/
	DSPOMDP *model = InitializeModel(options);
	assert(model != NULL);

	/* =========================
	 * initialize world
	 * =========================*/
	World *world = InitializeWorld(world_type, model, options);
	assert(world != NULL);

	/* =========================
	 * initialize belief
	 * =========================*/
	Belief* belief = model->InitialBelief(world->GetCurrentState(), belief_type);
	assert(belief != NULL);

	/* =========================
	 * initialize solver
	 * =========================*/
	Solver *solver = InitializeSolver(model, belief, solver_type, options);

	/* =========================
	 * initialize logger
	 * =========================*/
	Logger *logger = NULL;
	InitializeLogger(logger, options, model, belief, solver, num_runs,
			main_clock_start, world, world_type, time_limit, solver_type);
	//logger->world_seed(world_seed);

	int start_run = 0;

	/* =========================
	 * Display parameters
	 * =========================*/
	DisplayParameters(options, model);

	/* =========================
	 * run evaluation
	 * =========================*/
	EvaluationLoop(model, world, belief, belief_type, solver, logger,
			options, main_clock_start, num_runs, start_run);

	//logger->End();

	PrintResult(num_runs, logger, main_clock_start);

	return 0;
}